

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::struct_to_invocation
          (string *__return_storage_ptr__,t_rs_generator *this,t_struct *tstruct,
          string *field_prefix)

{
  t_field *tfield;
  bool bVar1;
  ostream *poVar2;
  pointer pptVar3;
  vector<t_field_*,_std::allocator<t_field_*>_> fields;
  ostringstream args;
  _Vector_base<t_field_*,_std::allocator<t_field_*>_> local_1e0;
  string local_1c8;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&local_1e0,
             &tstruct->members_in_id_order_);
  bVar1 = true;
  for (pptVar3 = local_1e0._M_impl.super__Vector_impl_data._M_start;
      pptVar3 != local_1e0._M_impl.super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    tfield = *pptVar3;
    if (!bVar1) {
      std::operator<<(&local_1a8,", ");
    }
    poVar2 = std::operator<<(&local_1a8,(string *)field_prefix);
    rust_field_name_abi_cxx11_(&local_1c8,this,tfield);
    std::operator<<(poVar2,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar1 = false;
  }
  std::__cxx11::stringbuf::str();
  std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base(&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::struct_to_invocation(t_struct* tstruct, const string& field_prefix) {
  ostringstream args;

  bool first_arg = true;
  std::vector<t_field*> fields = tstruct->get_sorted_members();
  std::vector<t_field*>::iterator field_iter;
  for (field_iter = fields.begin(); field_iter != fields.end(); ++field_iter) {
    t_field* tfield = (*field_iter);

    if (first_arg) {
      first_arg = false;
    } else {
      args << ", ";
    }

    args << field_prefix << rust_field_name(tfield);
  }

  return args.str();
}